

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O1

FT_Error FT_Bitmap_Convert(FT_Library library,FT_Bitmap *source,FT_Bitmap *target,FT_Int alignment)

{
  FT_Memory memory_00;
  uint in_EAX;
  FT_Error FVar1;
  uchar *puVar2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  byte *__dest;
  FT_Memory memory;
  byte *__src;
  FT_Error error;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if (library == (FT_Library)0x0) {
    FVar1 = 0x21;
  }
  else {
    FVar1 = 6;
    if (target != (FT_Bitmap *)0x0 && source != (FT_Bitmap *)0x0) {
      if ((byte)(source->pixel_mode - 1) < 7) {
        memory_00 = library->memory;
        if ((target->pitch == 0) && (source->pitch < 0)) {
          bVar9 = 1;
        }
        else {
          bVar9 = (byte)((uint)target->pitch >> 0x1f);
        }
        uVar3 = source->width;
        ft_mem_free(memory_00,target->buffer);
        target->buffer = (uchar *)0x0;
        target->num_grays = 0;
        target->pixel_mode = '\0';
        target->palette_mode = '\0';
        *(undefined4 *)&target->field_0x1c = 0;
        target->rows = 0;
        target->width = 0;
        *(undefined8 *)&target->pitch = 0;
        target->palette = (void *)0x0;
        target->pixel_mode = '\x02';
        uVar6 = source->rows;
        target->rows = uVar6;
        target->width = source->width;
        uVar10 = uVar3;
        if ((alignment != 0) && (iVar5 = (int)uVar3 % alignment, iVar5 != 0)) {
          uVar10 = uVar3 - (iVar5 + alignment);
          if (0 < alignment) {
            uVar10 = (uVar3 + alignment) - iVar5;
          }
        }
        puVar2 = (uchar *)ft_mem_qrealloc(memory_00,(long)(int)uVar10,0,(ulong)uVar6,(void *)0x0,
                                          (FT_Error *)((long)&uStack_38 + 4));
        target->buffer = puVar2;
        if (uStack_38._4_4_ != 0) {
          return uStack_38._4_4_;
        }
        uVar3 = -uVar10;
        if (bVar9 == 0) {
          uVar3 = uVar10;
        }
        target->pitch = uVar3;
      }
      else {
        uStack_38 = CONCAT44(6,in_EAX);
      }
      __src = source->buffer;
      if (source->pitch < 0) {
        __src = __src + -(long)(int)((source->rows - 1) * source->pitch);
      }
      __dest = target->buffer;
      if (target->pitch < 0) {
        __dest = __dest + -(long)(int)((target->rows - 1) * target->pitch);
      }
      switch(source->pixel_mode) {
      case '\x01':
        target->num_grays = 2;
        for (uVar3 = source->rows; uVar3 != 0; uVar3 = uVar3 - 1) {
          pbVar4 = __dest;
          pbVar7 = __src;
          if (7 < source->width) {
            uVar6 = source->width >> 3;
            do {
              bVar9 = *pbVar7;
              *pbVar4 = bVar9 >> 7;
              pbVar4[1] = bVar9 >> 6 & 1;
              pbVar4[2] = bVar9 >> 5 & 1;
              pbVar4[3] = bVar9 >> 4 & 1;
              pbVar4[4] = bVar9 >> 3 & 1;
              pbVar4[5] = bVar9 >> 2 & 1;
              pbVar4[6] = bVar9 >> 1 & 1;
              pbVar4[7] = bVar9 & 1;
              pbVar4 = pbVar4 + 8;
              pbVar7 = pbVar7 + 1;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
          }
          uVar6 = source->width;
          if ((uVar6 & 7) != 0) {
            bVar9 = *pbVar7;
            lVar8 = 0;
            do {
              pbVar4[lVar8] = bVar9 >> 7;
              bVar9 = bVar9 * '\x02';
              lVar8 = lVar8 + 1;
            } while ((uVar6 & 7) != (uint)lVar8);
          }
          __src = __src + source->pitch;
          __dest = __dest + target->pitch;
        }
        break;
      case '\x02':
      case '\x05':
      case '\x06':
        uVar3 = source->width;
        target->num_grays = 0x100;
        for (uVar6 = source->rows; uVar6 != 0; uVar6 = uVar6 - 1) {
          memcpy(__dest,__src,(ulong)uVar3);
          __src = __src + source->pitch;
          __dest = __dest + target->pitch;
        }
        break;
      case '\x03':
        target->num_grays = 4;
        for (uVar3 = source->rows; uVar3 != 0; uVar3 = uVar3 - 1) {
          pbVar4 = __dest;
          pbVar7 = __src;
          if (3 < source->width) {
            uVar6 = source->width >> 2;
            do {
              bVar9 = *pbVar7;
              *pbVar4 = bVar9 >> 6;
              pbVar4[1] = bVar9 >> 4 & 3;
              pbVar4[2] = bVar9 >> 2 & 3;
              pbVar4[3] = bVar9 & 3;
              pbVar7 = pbVar7 + 1;
              pbVar4 = pbVar4 + 4;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
          }
          uVar6 = source->width;
          if ((uVar6 & 3) != 0) {
            bVar9 = *pbVar7;
            lVar8 = 0;
            do {
              pbVar4[lVar8] = bVar9 >> 6;
              bVar9 = bVar9 << 2;
              lVar8 = lVar8 + 1;
            } while ((uVar6 & 3) != (uint)lVar8);
          }
          __src = __src + source->pitch;
          __dest = __dest + target->pitch;
        }
        break;
      case '\x04':
        target->num_grays = 0x10;
        for (uVar3 = source->rows; uVar3 != 0; uVar3 = uVar3 - 1) {
          pbVar4 = __dest;
          pbVar7 = __src;
          if (1 < source->width) {
            uVar6 = source->width >> 1;
            do {
              bVar9 = *pbVar7;
              *pbVar4 = bVar9 >> 4;
              pbVar4[1] = bVar9 & 0xf;
              pbVar7 = pbVar7 + 1;
              pbVar4 = pbVar4 + 2;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
          }
          if ((source->width & 1) != 0) {
            *pbVar4 = *pbVar7 >> 4;
          }
          __src = __src + source->pitch;
          __dest = __dest + target->pitch;
        }
        break;
      case '\a':
        target->num_grays = 0x100;
        for (uVar3 = source->rows; uVar3 != 0; uVar3 = uVar3 - 1) {
          uVar6 = source->width;
          if (uVar6 != 0) {
            lVar8 = 0;
            do {
              bVar9 = __src[lVar8 * 4 + 3];
              if (bVar9 == 0) {
                bVar9 = 0;
              }
              else {
                bVar9 = bVar9 - (char)(((ulong)__src[lVar8 * 4 + 2] * (ulong)__src[lVar8 * 4 + 2] *
                                        0x3671 + (ulong)__src[lVar8 * 4 + 1] *
                                                 (ulong)__src[lVar8 * 4 + 1] * 0xb714 +
                                                 (ulong)__src[lVar8 * 4] * (ulong)__src[lVar8 * 4] *
                                                 0x127b >> 0x10) / (ulong)bVar9);
              }
              __dest[lVar8] = bVar9;
              lVar8 = lVar8 + 1;
            } while (uVar6 != (uint)lVar8);
          }
          __src = __src + source->pitch;
          __dest = __dest + target->pitch;
        }
      }
      FVar1 = uStack_38._4_4_;
    }
  }
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Convert( FT_Library        library,
                     const FT_Bitmap  *source,
                     FT_Bitmap        *target,
                     FT_Int            alignment )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Memory  memory;

    FT_Byte*  s;
    FT_Byte*  t;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !source || !target )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    switch ( source->pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
    case FT_PIXEL_MODE_GRAY:
    case FT_PIXEL_MODE_GRAY2:
    case FT_PIXEL_MODE_GRAY4:
    case FT_PIXEL_MODE_LCD:
    case FT_PIXEL_MODE_LCD_V:
    case FT_PIXEL_MODE_BGRA:
      {
        FT_Int  width = (FT_Int)source->width;
        FT_Int  neg   = ( target->pitch == 0 && source->pitch < 0 ) ||
                          target->pitch  < 0;


        FT_Bitmap_Done( library, target );

        target->pixel_mode = FT_PIXEL_MODE_GRAY;
        target->rows       = source->rows;
        target->width      = source->width;

        if ( alignment )
        {
          FT_Int  rem = width % alignment;


          if ( rem )
            width = alignment > 0 ? width - rem + alignment
                                  : width - rem - alignment;
        }

        if ( FT_QALLOC_MULT( target->buffer, target->rows, width ) )
          return error;

        target->pitch = neg ? -width : width;
      }
      break;

    default:
      error = FT_THROW( Invalid_Argument );
    }

    s = source->buffer;
    t = target->buffer;

    /* take care of bitmap flow */
    if ( source->pitch < 0 )
      s -= source->pitch * (FT_Int)( source->rows - 1 );
    if ( target->pitch < 0 )
      t -= target->pitch * (FT_Int)( target->rows - 1 );

    switch ( source->pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
      {
        FT_UInt  i;


        target->num_grays = 2;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          /* get the full bytes */
          for ( j = source->width >> 3; j > 0; j-- )
          {
            FT_Int  val = ss[0]; /* avoid a byte->int cast on each line */


            tt[0] = (FT_Byte)( ( val & 0x80 ) >> 7 );
            tt[1] = (FT_Byte)( ( val & 0x40 ) >> 6 );
            tt[2] = (FT_Byte)( ( val & 0x20 ) >> 5 );
            tt[3] = (FT_Byte)( ( val & 0x10 ) >> 4 );
            tt[4] = (FT_Byte)( ( val & 0x08 ) >> 3 );
            tt[5] = (FT_Byte)( ( val & 0x04 ) >> 2 );
            tt[6] = (FT_Byte)( ( val & 0x02 ) >> 1 );
            tt[7] = (FT_Byte)(   val & 0x01 );

            tt += 8;
            ss += 1;
          }

          /* get remaining pixels (if any) */
          j = source->width & 7;
          if ( j > 0 )
          {
            FT_Int  val = *ss;


            for ( ; j > 0; j-- )
            {
              tt[0] = (FT_Byte)( ( val & 0x80 ) >> 7);
              val <<= 1;
              tt   += 1;
            }
          }

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_GRAY:
    case FT_PIXEL_MODE_LCD:
    case FT_PIXEL_MODE_LCD_V:
      {
        FT_UInt  width = source->width;
        FT_UInt  i;


        target->num_grays = 256;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_ARRAY_COPY( t, s, width );

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_GRAY2:
      {
        FT_UInt  i;


        target->num_grays = 4;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          /* get the full bytes */
          for ( j = source->width >> 2; j > 0; j-- )
          {
            FT_Int  val = ss[0];


            tt[0] = (FT_Byte)( ( val & 0xC0 ) >> 6 );
            tt[1] = (FT_Byte)( ( val & 0x30 ) >> 4 );
            tt[2] = (FT_Byte)( ( val & 0x0C ) >> 2 );
            tt[3] = (FT_Byte)( ( val & 0x03 ) );

            ss += 1;
            tt += 4;
          }

          j = source->width & 3;
          if ( j > 0 )
          {
            FT_Int  val = ss[0];


            for ( ; j > 0; j-- )
            {
              tt[0]  = (FT_Byte)( ( val & 0xC0 ) >> 6 );
              val  <<= 2;
              tt    += 1;
            }
          }

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_GRAY4:
      {
        FT_UInt  i;


        target->num_grays = 16;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          /* get the full bytes */
          for ( j = source->width >> 1; j > 0; j-- )
          {
            FT_Int  val = ss[0];


            tt[0] = (FT_Byte)( ( val & 0xF0 ) >> 4 );
            tt[1] = (FT_Byte)( ( val & 0x0F ) );

            ss += 1;
            tt += 2;
          }

          if ( source->width & 1 )
            tt[0] = (FT_Byte)( ( ss[0] & 0xF0 ) >> 4 );

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_BGRA:
      {
        FT_UInt  i;


        target->num_grays = 256;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          for ( j = source->width; j > 0; j-- )
          {
            tt[0] = ft_gray_for_premultiplied_srgb_bgra( ss );

            ss += 4;
            tt += 1;
          }

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;

    default:
      ;
    }

    return error;
  }